

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O1

int __thiscall ncnn::Embed::forward(Embed *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  
  Mat::create(top_blob,this->num_output,bottom_blob->c * (int)bottom_blob->cstep,4,
              opt->blob_allocator);
  pvVar7 = top_blob->data;
  iVar6 = -100;
  if ((pvVar7 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (this->int8_scale_term == 0) {
      iVar6 = top_blob->h;
      if (0 < (long)iVar6) {
        iVar1 = this->input_dim;
        uVar2 = top_blob->w;
        pvVar7 = (this->bias_data).data;
        lVar12 = 0;
        do {
          iVar9 = top_blob->w;
          pvVar3 = top_blob->data;
          sVar5 = top_blob->elemsize;
          iVar8 = *(int *)((long)bottom_blob->data + lVar12 * 4);
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          if (iVar1 <= iVar8) {
            iVar8 = iVar1 + -1;
          }
          pvVar10 = (void *)((long)(int)(iVar8 * uVar2) * 4 + (long)(this->weight_data).data);
          if (pvVar7 == (void *)0x0) {
            memcpy((void *)((long)pvVar3 + iVar9 * lVar12 * sVar5),pvVar10,(long)(int)uVar2 * 4);
          }
          else if (0 < (int)uVar2) {
            uVar11 = 0;
            do {
              *(float *)((long)pvVar3 + uVar11 * 4 + sVar5 * lVar12 * (long)iVar9) =
                   *(float *)((long)pvVar7 + uVar11 * 4) + *(float *)((long)pvVar10 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar2 != uVar11);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != iVar6);
      }
    }
    else {
      iVar6 = top_blob->h;
      if (0 < (long)iVar6) {
        iVar1 = this->input_dim;
        uVar2 = top_blob->w;
        pvVar3 = (this->bias_data).data;
        fVar13 = 1.0 / this->weight_data_int8_scale;
        pvVar10 = bottom_blob->data;
        pvVar4 = (this->weight_data).data;
        sVar5 = top_blob->elemsize;
        lVar12 = 0;
        do {
          iVar9 = *(int *)((long)pvVar10 + lVar12 * 4);
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          if (iVar1 <= iVar9) {
            iVar9 = iVar1 + -1;
          }
          if (pvVar3 == (void *)0x0) {
            if (0 < (int)uVar2) {
              uVar11 = 0;
              do {
                *(float *)((long)pvVar7 + uVar11 * 4) =
                     (float)(int)*(char *)((long)pvVar4 + uVar11 + (long)(int)(iVar9 * uVar2)) *
                     fVar13;
                uVar11 = uVar11 + 1;
              } while (uVar2 != uVar11);
            }
          }
          else if (0 < (int)uVar2) {
            uVar11 = 0;
            do {
              *(float *)((long)pvVar7 + uVar11 * 4) =
                   (float)(int)*(char *)((long)pvVar4 + uVar11 + (long)(int)(iVar9 * uVar2)) *
                   fVar13 + *(float *)((long)pvVar3 + uVar11 * 4);
              uVar11 = uVar11 + 1;
            } while (uVar2 != uVar11);
          }
          lVar12 = lVar12 + 1;
          pvVar7 = (void *)((long)pvVar7 + (long)(int)uVar2 * sVar5);
        } while (lVar12 != iVar6);
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Embed::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int words = static_cast<int>(bottom_blob.total());

    top_blob.create(num_output, words, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if NCNN_INT8
    if (int8_scale_term)
    {
        embed_int8(bottom_blob, weight_data, weight_data_int8_scale, bias_data, top_blob, input_dim, opt);
    }
    else
#endif // NCNN_INT8
    {
        embed(bottom_blob, weight_data, bias_data, top_blob, input_dim, opt);
    }

    return 0;
}